

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_uses_children
                 (lysc_ctx *ctx,lysp_node_uses *uses_p,uint16_t inherited_flags,lysp_node *child,
                 lysp_module *grp_mod,lysc_node *parent,ly_set *child_set,
                 ly_bool child_unres_disabled)

{
  lysc_node *node;
  lysp_when *when_p;
  LY_ERR LVar1;
  lysc_node *ctx_node;
  ulong uVar2;
  uint32_t uVar3;
  ly_bool enabled;
  lysc_when *when_shared;
  ly_bool local_61;
  uint32_t local_60;
  uint local_5c;
  lysp_module *local_58;
  lysp_module *local_50;
  lysp_node *local_48;
  lysp_node_uses *local_40;
  lysc_when *local_38;
  
  local_50 = ctx->pmod;
  uVar3 = ctx->compile_opts;
  local_38 = (lysc_when *)0x0;
  local_40 = uses_p;
  if (child_set == (ly_set *)0x0) {
    __assert_fail("child_set",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
                  ,0xf71,
                  "LY_ERR lys_compile_uses_children(struct lysc_ctx *, struct lysp_node_uses *, uint16_t, struct lysp_node *, struct lysp_module *, struct lysc_node *, struct ly_set *, ly_bool)"
                 );
  }
  if (child != (lysp_node *)0x0) {
    uVar2 = (ulong)child_set->count;
    local_5c = (uint)inherited_flags;
    local_60 = uVar3;
    local_58 = grp_mod;
    do {
      ctx->pmod = local_58;
      LVar1 = lys_compile_node(ctx,child,parent,(uint16_t)local_5c,child_set);
      if ((LVar1 != LY_SUCCESS) ||
         (local_48 = child, LVar1 = lys_eval_iffeatures(ctx->ctx,child->iffeatures,&local_61),
         LVar1 != LY_SUCCESS)) goto LAB_0014dc82;
      if ((local_61 == '\0') && ((ctx->compile_opts & 0xb) == 0)) {
        ctx->compile_opts = ctx->compile_opts | 2;
      }
      ctx->pmod = local_50;
      if ((uint)uVar2 < child_set->count) {
        uVar2 = uVar2 & 0xffffffff;
        do {
          node = (lysc_node *)(child_set->field_2).dnodes[uVar2];
          when_p = local_40->when;
          if (when_p != (lysp_when *)0x0) {
            ctx_node = lysc_data_node(parent);
            LVar1 = lys_compile_when(ctx,when_p,(uint16_t)local_5c,parent,ctx_node,node,&local_38);
            uVar3 = local_60;
            if (LVar1 != LY_SUCCESS) goto LAB_0014dc82;
          }
          if (child_unres_disabled != '\0') {
            ly_set_add(&ctx->unres->disabled,node,'\x01',(uint32_t *)0x0);
          }
          uVar2 = uVar2 + 1;
          uVar3 = local_60;
        } while (uVar2 < child_set->count);
      }
      ctx->compile_opts = uVar3;
      child = local_48->next;
    } while (child != (lysp_node *)0x0);
  }
  LVar1 = LY_SUCCESS;
LAB_0014dc82:
  ctx->compile_opts = uVar3;
  return LVar1;
}

Assistant:

static LY_ERR
lys_compile_uses_children(struct lysc_ctx *ctx, struct lysp_node_uses *uses_p, uint16_t inherited_flags,
        struct lysp_node *child, struct lysp_module *grp_mod, struct lysc_node *parent, struct ly_set *child_set,
        ly_bool child_unres_disabled)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysp_module *mod_old = ctx->pmod;
    uint32_t child_i, opt_prev = ctx->compile_opts;
    ly_bool enabled;
    struct lysp_node *pnode;
    struct lysc_node *node;
    struct lysc_when *when_shared = NULL;

    assert(child_set);

    child_i = child_set->count;
    LY_LIST_FOR(child, pnode) {
        /* compile the nodes with their parsed (grouping) module */
        ctx->pmod = grp_mod;
        LY_CHECK_GOTO(rc = lys_compile_node(ctx, pnode, parent, inherited_flags, child_set), cleanup);

        /* eval if-features again for the rest of this node processing */
        LY_CHECK_GOTO(rc = lys_eval_iffeatures(ctx->ctx, pnode->iffeatures, &enabled), cleanup);
        if (!enabled && !(ctx->compile_opts & (LYS_COMPILE_NO_DISABLED | LYS_COMPILE_DISABLED | LYS_COMPILE_GROUPING))) {
            ctx->compile_opts |= LYS_COMPILE_DISABLED;
        }

        /* restore the parsed module */
        ctx->pmod = mod_old;

        /* since the uses node is not present in the compiled tree, we need to pass some of its
         * statements to all its children */
        while (child_i < child_set->count) {
            node = child_set->snodes[child_i];

            if (uses_p->when) {
                /* pass uses when to all the children */
                rc = lys_compile_when(ctx, uses_p->when, inherited_flags, parent, lysc_data_node(parent), node, &when_shared);
                LY_CHECK_GOTO(rc, cleanup);
            }

            if (child_unres_disabled) {
                /* child is disabled by the uses if-features */
                ly_set_add(&ctx->unres->disabled, node, 1, NULL);
            }

            /* child processed */
            ++child_i;
        }

        /* next iter */
        ctx->compile_opts = opt_prev;
    }

cleanup:
    ctx->compile_opts = opt_prev;
    return rc;
}